

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::emit_complex_bitcast
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0)

{
  bool forwarding;
  SPIRType *pSVar1;
  SPIRType *pSVar2;
  undefined1 local_e8 [80];
  undefined1 local_98 [64];
  string local_58 [8];
  string expr;
  SPIRType *input_type;
  SPIRType *output_type;
  uint32_t op0_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op0);
  ::std::__cxx11::string::string(local_58);
  if (((*(int *)&(pSVar1->super_IVariant).field_0xc == 0xc) &&
      (*(int *)&(pSVar2->super_IVariant).field_0xc == 0xd)) && (pSVar2->vecsize == 1)) {
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_98,(uint32_t)this,SUB41(op0,0));
    join<char_const(&)[33],std::__cxx11::string,char_const(&)[3]>
              ((spirv_cross *)(local_98 + 0x20),(char (*) [33])"unpackFloat2x16(floatBitsToUint(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (char (*) [3])0x5c674f);
    ::std::__cxx11::string::operator=(local_58,(string *)(local_98 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_98 + 0x20));
    ::std::__cxx11::string::~string((string *)local_98);
  }
  else {
    if (((*(int *)&(pSVar1->super_IVariant).field_0xc != 0xd) ||
        (*(int *)&(pSVar2->super_IVariant).field_0xc != 0xc)) || (pSVar2->vecsize != 2)) {
      this_local._7_1_ = false;
      goto LAB_00361412;
    }
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_e8,(uint32_t)this,SUB41(op0,0));
    join<char_const(&)[31],std::__cxx11::string,char_const(&)[3]>
              ((spirv_cross *)(local_e8 + 0x20),(char (*) [31])"uintBitsToFloat(packFloat2x16(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
               (char (*) [3])0x5c674f);
    ::std::__cxx11::string::operator=(local_58,(string *)(local_e8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_e8 + 0x20));
    ::std::__cxx11::string::~string((string *)local_e8);
  }
  forwarding = should_forward(this,op0);
  emit_op(this,result_type,id,(string *)local_58,forwarding,false);
  this_local._7_1_ = true;
LAB_00361412:
  ::std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::emit_complex_bitcast(uint32_t result_type, uint32_t id, uint32_t op0)
{
	// Some bitcasts may require complex casting sequences, and are implemented here.
	// Otherwise a simply unary function will do with bitcast_glsl_op.

	auto &output_type = get<SPIRType>(result_type);
	auto &input_type = expression_type(op0);
	string expr;

	if (output_type.basetype == SPIRType::Half && input_type.basetype == SPIRType::Float && input_type.vecsize == 1)
		expr = join("unpackFloat2x16(floatBitsToUint(", to_unpacked_expression(op0), "))");
	else if (output_type.basetype == SPIRType::Float && input_type.basetype == SPIRType::Half &&
	         input_type.vecsize == 2)
		expr = join("uintBitsToFloat(packFloat2x16(", to_unpacked_expression(op0), "))");
	else
		return false;

	emit_op(result_type, id, expr, should_forward(op0));
	return true;
}